

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O1

void __thiscall wabt::RegisterCommand::~RegisterCommand(RegisterCommand *this)

{
  pointer pcVar1;
  
  (this->super_CommandMixin<(wabt::CommandType)2>).super_Command._vptr_Command =
       (_func_int **)&PTR__RegisterCommand_001c38d8;
  Var::~Var(&this->var);
  pcVar1 = (this->module_name)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->module_name).field_2) {
    operator_delete(pcVar1);
  }
  operator_delete(this);
  return;
}

Assistant:

RegisterCommand(string_view module_name, const Var& var)
      : module_name(module_name), var(var) {}